

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

string * __thiscall Tracker::logSamples(string *__return_storage_ptr__,Tracker *this,string *_track)

{
  iterator iVar1;
  ulong uVar2;
  long local_138;
  string track_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
          ::find(&(this->m_data)._M_t,_track);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&track_name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&track_name);
    std::__cxx11::string::string((string *)&track_name,(string *)(iVar1._M_node + 1));
    local_138 = 0x10;
    for (uVar2 = 0;
        uVar2 < (ulong)(((long)iVar1._M_node[3]._M_left - (long)iVar1._M_node[3]._M_parent) / 0x18);
        uVar2 = uVar2 + 1) {
      std::operator+(&local_110,&track_name,",");
      vera::toString<double>
                (&local_b0,(double *)((long)iVar1._M_node[3]._M_parent + local_138 + -0x10));
      std::operator+(&local_90,&local_110,&local_b0);
      std::operator+(&local_f0,&local_90,",");
      vera::toString<double>
                (&local_d0,(double *)((long)&(iVar1._M_node[3]._M_parent)->_M_color + local_138));
      std::operator+(&local_70,&local_f0,&local_d0);
      std::operator+(&local_50,&local_70,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_110);
      local_138 = local_138 + 0x18;
    }
    std::__cxx11::string::~string((string *)&track_name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logSamples(const std::string& _track) {
    std::map<std::string, StatTrack>::iterator it = m_data.find(_track);

    if ( it == m_data.end() )
        return "";

    std::string log = "";
    std::string track_name = it->first;
    
    for (size_t i = 0; i < it->second.samples.size(); i++)
        log +=  track_name + "," + 
                vera::toString(it->second.samples[i].startMs) + "," + 
                vera::toString(it->second.samples[i].durationMs) + "\n";

    return log;
}